

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

QSize __thiscall QMdi::ControlLabel::sizeHint(ControlLabel *this)

{
  bool bVar1;
  QSize QVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  auVar4 = QPixmap::deviceIndependentSize();
  dVar3 = (double)((ulong)auVar4._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._0_8_;
  bVar1 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  QVar2.wd.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar3);
  dVar3 = (double)((ulong)auVar4._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._8_8_;
  bVar1 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  QVar2.ht.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar3);
  return QVar2;
}

Assistant:

QSize ControlLabel::sizeHint() const
{
    return label.deviceIndependentSize().toSize();
}